

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# liveglsl_tests.cpp
# Opt level: O2

void utest_utils_utils_extract_base_path(int *utest_result,size_t utest_index)

{
  FILE *pFVar1;
  bool bVar2;
  char *pcVar3;
  allocator<char> local_61;
  string local_60;
  string local_40;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_60,"/path/to/file.txt",&local_61);
  ExtractBasePath(&local_40,&local_60);
  bVar2 = std::operator==(&local_40,"/path/to");
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  if (!bVar2) {
    if (utest_state.output != (FILE *)0x0) {
      fprintf((FILE *)utest_state.output,"%s:%u: Failure\n",
              "/workspace/llm4binary/github/license_c_cmakelists/karimnaaji[P]live-glsl/tests/liveglsl_tests.cpp"
              ,0x13a);
    }
    printf("%s:%u: Failure\n",
           "/workspace/llm4binary/github/license_c_cmakelists/karimnaaji[P]live-glsl/tests/liveglsl_tests.cpp"
           ,0x13a);
    if (utest_state.output != (FILE *)0x0) {
      fwrite("  Expected : true\n",0x12,1,(FILE *)utest_state.output);
    }
    puts("  Expected : true");
    pFVar1 = utest_state.output;
    if (utest_state.output != (FILE *)0x0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_60,"/path/to/file.txt",&local_61);
      ExtractBasePath(&local_40,&local_60);
      bVar2 = std::operator==(&local_40,"/path/to");
      pcVar3 = "false";
      if (bVar2) {
        pcVar3 = "true";
      }
      fprintf((FILE *)pFVar1,"    Actual : %s\n",pcVar3);
      std::__cxx11::string::~string((string *)&local_40);
      std::__cxx11::string::~string((string *)&local_60);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_60,"/path/to/file.txt",&local_61);
    ExtractBasePath(&local_40,&local_60);
    bVar2 = std::operator==(&local_40,"/path/to");
    pcVar3 = "false";
    if (bVar2) {
      pcVar3 = "true";
    }
    printf("    Actual : %s\n",pcVar3);
    std::__cxx11::string::~string((string *)&local_40);
    std::__cxx11::string::~string((string *)&local_60);
    *utest_result = 1;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_60,"/path/to/another.file.docx",&local_61);
  ExtractBasePath(&local_40,&local_60);
  bVar2 = std::operator==(&local_40,"/path/to");
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  if (!bVar2) {
    if (utest_state.output != (FILE *)0x0) {
      fprintf((FILE *)utest_state.output,"%s:%u: Failure\n",
              "/workspace/llm4binary/github/license_c_cmakelists/karimnaaji[P]live-glsl/tests/liveglsl_tests.cpp"
              ,0x13b);
    }
    printf("%s:%u: Failure\n",
           "/workspace/llm4binary/github/license_c_cmakelists/karimnaaji[P]live-glsl/tests/liveglsl_tests.cpp"
           ,0x13b);
    if (utest_state.output != (FILE *)0x0) {
      fwrite("  Expected : true\n",0x12,1,(FILE *)utest_state.output);
    }
    puts("  Expected : true");
    pFVar1 = utest_state.output;
    if (utest_state.output != (FILE *)0x0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_60,"/path/to/another.file.docx",&local_61);
      ExtractBasePath(&local_40,&local_60);
      bVar2 = std::operator==(&local_40,"/path/to");
      pcVar3 = "false";
      if (bVar2) {
        pcVar3 = "true";
      }
      fprintf((FILE *)pFVar1,"    Actual : %s\n",pcVar3);
      std::__cxx11::string::~string((string *)&local_40);
      std::__cxx11::string::~string((string *)&local_60);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_60,"/path/to/another.file.docx",&local_61);
    ExtractBasePath(&local_40,&local_60);
    bVar2 = std::operator==(&local_40,"/path/to");
    pcVar3 = "false";
    if (bVar2) {
      pcVar3 = "true";
    }
    printf("    Actual : %s\n",pcVar3);
    std::__cxx11::string::~string((string *)&local_40);
    std::__cxx11::string::~string((string *)&local_60);
    *utest_result = 1;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"example",&local_61);
  ExtractBasePath(&local_40,&local_60);
  bVar2 = std::operator==(&local_40,"");
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  if (!bVar2) {
    if (utest_state.output != (FILE *)0x0) {
      fprintf((FILE *)utest_state.output,"%s:%u: Failure\n",
              "/workspace/llm4binary/github/license_c_cmakelists/karimnaaji[P]live-glsl/tests/liveglsl_tests.cpp"
              ,0x13c);
    }
    printf("%s:%u: Failure\n",
           "/workspace/llm4binary/github/license_c_cmakelists/karimnaaji[P]live-glsl/tests/liveglsl_tests.cpp"
           ,0x13c);
    if (utest_state.output != (FILE *)0x0) {
      fwrite("  Expected : true\n",0x12,1,(FILE *)utest_state.output);
    }
    puts("  Expected : true");
    pFVar1 = utest_state.output;
    if (utest_state.output != (FILE *)0x0) {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"example",&local_61);
      ExtractBasePath(&local_40,&local_60);
      bVar2 = std::operator==(&local_40,"");
      pcVar3 = "false";
      if (bVar2) {
        pcVar3 = "true";
      }
      fprintf((FILE *)pFVar1,"    Actual : %s\n",pcVar3);
      std::__cxx11::string::~string((string *)&local_40);
      std::__cxx11::string::~string((string *)&local_60);
    }
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"example",&local_61);
    ExtractBasePath(&local_40,&local_60);
    bVar2 = std::operator==(&local_40,"");
    pcVar3 = "false";
    if (bVar2) {
      pcVar3 = "true";
    }
    printf("    Actual : %s\n",pcVar3);
    std::__cxx11::string::~string((string *)&local_40);
    std::__cxx11::string::~string((string *)&local_60);
    *utest_result = 1;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"example.txt",&local_61);
  ExtractBasePath(&local_40,&local_60);
  bVar2 = std::operator==(&local_40,"");
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  if (!bVar2) {
    if (utest_state.output != (FILE *)0x0) {
      fprintf((FILE *)utest_state.output,"%s:%u: Failure\n",
              "/workspace/llm4binary/github/license_c_cmakelists/karimnaaji[P]live-glsl/tests/liveglsl_tests.cpp"
              ,0x13d);
    }
    printf("%s:%u: Failure\n",
           "/workspace/llm4binary/github/license_c_cmakelists/karimnaaji[P]live-glsl/tests/liveglsl_tests.cpp"
           ,0x13d);
    if (utest_state.output != (FILE *)0x0) {
      fwrite("  Expected : true\n",0x12,1,(FILE *)utest_state.output);
    }
    puts("  Expected : true");
    pFVar1 = utest_state.output;
    if (utest_state.output != (FILE *)0x0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_60,"example.txt",&local_61);
      ExtractBasePath(&local_40,&local_60);
      bVar2 = std::operator==(&local_40,"");
      pcVar3 = "false";
      if (bVar2) {
        pcVar3 = "true";
      }
      fprintf((FILE *)pFVar1,"    Actual : %s\n",pcVar3);
      std::__cxx11::string::~string((string *)&local_40);
      std::__cxx11::string::~string((string *)&local_60);
    }
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"example.txt",&local_61);
    ExtractBasePath(&local_40,&local_60);
    bVar2 = std::operator==(&local_40,"");
    pcVar3 = "false";
    if (bVar2) {
      pcVar3 = "true";
    }
    printf("    Actual : %s\n",pcVar3);
    std::__cxx11::string::~string((string *)&local_40);
    std::__cxx11::string::~string((string *)&local_60);
    *utest_result = 1;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"./filename.txt",&local_61)
  ;
  ExtractBasePath(&local_40,&local_60);
  bVar2 = std::operator==(&local_40,".");
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  if (!bVar2) {
    if (utest_state.output != (FILE *)0x0) {
      fprintf((FILE *)utest_state.output,"%s:%u: Failure\n",
              "/workspace/llm4binary/github/license_c_cmakelists/karimnaaji[P]live-glsl/tests/liveglsl_tests.cpp"
              ,0x13e);
    }
    printf("%s:%u: Failure\n",
           "/workspace/llm4binary/github/license_c_cmakelists/karimnaaji[P]live-glsl/tests/liveglsl_tests.cpp"
           ,0x13e);
    if (utest_state.output != (FILE *)0x0) {
      fwrite("  Expected : true\n",0x12,1,(FILE *)utest_state.output);
    }
    puts("  Expected : true");
    pFVar1 = utest_state.output;
    if (utest_state.output != (FILE *)0x0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_60,"./filename.txt",&local_61);
      ExtractBasePath(&local_40,&local_60);
      bVar2 = std::operator==(&local_40,".");
      pcVar3 = "false";
      if (bVar2) {
        pcVar3 = "true";
      }
      fprintf((FILE *)pFVar1,"    Actual : %s\n",pcVar3);
      std::__cxx11::string::~string((string *)&local_40);
      std::__cxx11::string::~string((string *)&local_60);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_60,"./filename.txt",&local_61);
    ExtractBasePath(&local_40,&local_60);
    bVar2 = std::operator==(&local_40,".");
    pcVar3 = "false";
    if (bVar2) {
      pcVar3 = "true";
    }
    printf("    Actual : %s\n",pcVar3);
    std::__cxx11::string::~string((string *)&local_40);
    std::__cxx11::string::~string((string *)&local_60);
    *utest_result = 1;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_60,"path/with/no/extension/",&local_61);
  ExtractBasePath(&local_40,&local_60);
  bVar2 = std::operator==(&local_40,"path/with/no/extension");
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  if (!bVar2) {
    if (utest_state.output != (FILE *)0x0) {
      fprintf((FILE *)utest_state.output,"%s:%u: Failure\n",
              "/workspace/llm4binary/github/license_c_cmakelists/karimnaaji[P]live-glsl/tests/liveglsl_tests.cpp"
              ,0x13f);
    }
    printf("%s:%u: Failure\n",
           "/workspace/llm4binary/github/license_c_cmakelists/karimnaaji[P]live-glsl/tests/liveglsl_tests.cpp"
           ,0x13f);
    if (utest_state.output != (FILE *)0x0) {
      fwrite("  Expected : true\n",0x12,1,(FILE *)utest_state.output);
    }
    puts("  Expected : true");
    pFVar1 = utest_state.output;
    if (utest_state.output != (FILE *)0x0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_60,"path/with/no/extension/",&local_61);
      ExtractBasePath(&local_40,&local_60);
      bVar2 = std::operator==(&local_40,"path/with/no/extension");
      pcVar3 = "false";
      if (bVar2) {
        pcVar3 = "true";
      }
      fprintf((FILE *)pFVar1,"    Actual : %s\n",pcVar3);
      std::__cxx11::string::~string((string *)&local_40);
      std::__cxx11::string::~string((string *)&local_60);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_60,"path/with/no/extension/",&local_61);
    ExtractBasePath(&local_40,&local_60);
    bVar2 = std::operator==(&local_40,"path/with/no/extension");
    pcVar3 = "false";
    if (bVar2) {
      pcVar3 = "true";
    }
    printf("    Actual : %s\n",pcVar3);
    std::__cxx11::string::~string((string *)&local_40);
    std::__cxx11::string::~string((string *)&local_60);
    *utest_result = 1;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"",&local_61);
  ExtractBasePath(&local_40,&local_60);
  bVar2 = std::operator==(&local_40,"");
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  if (!bVar2) {
    if (utest_state.output != (FILE *)0x0) {
      fprintf((FILE *)utest_state.output,"%s:%u: Failure\n",
              "/workspace/llm4binary/github/license_c_cmakelists/karimnaaji[P]live-glsl/tests/liveglsl_tests.cpp"
              ,0x140);
    }
    printf("%s:%u: Failure\n",
           "/workspace/llm4binary/github/license_c_cmakelists/karimnaaji[P]live-glsl/tests/liveglsl_tests.cpp"
           ,0x140);
    if (utest_state.output != (FILE *)0x0) {
      fwrite("  Expected : true\n",0x12,1,(FILE *)utest_state.output);
    }
    puts("  Expected : true");
    pFVar1 = utest_state.output;
    if (utest_state.output != (FILE *)0x0) {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"",&local_61);
      ExtractBasePath(&local_40,&local_60);
      bVar2 = std::operator==(&local_40,"");
      pcVar3 = "false";
      if (bVar2) {
        pcVar3 = "true";
      }
      fprintf((FILE *)pFVar1,"    Actual : %s\n",pcVar3);
      std::__cxx11::string::~string((string *)&local_40);
      std::__cxx11::string::~string((string *)&local_60);
    }
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"",&local_61);
    ExtractBasePath(&local_40,&local_60);
    bVar2 = std::operator==(&local_40,"");
    pcVar3 = "false";
    if (bVar2) {
      pcVar3 = "true";
    }
    printf("    Actual : %s\n",pcVar3);
    std::__cxx11::string::~string((string *)&local_40);
    std::__cxx11::string::~string((string *)&local_60);
    *utest_result = 1;
  }
  return;
}

Assistant:

UTEST(utils, utils_extract_base_path) {
    T(ExtractBasePath("/path/to/file.txt") == "/path/to");
    T(ExtractBasePath("/path/to/another.file.docx") == "/path/to");
    T(ExtractBasePath("example") == "");
    T(ExtractBasePath("example.txt") == "");
    T(ExtractBasePath("./filename.txt") == ".");
    T(ExtractBasePath("path/with/no/extension/") == "path/with/no/extension");
    T(ExtractBasePath("") == "");
}